

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  uint uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar30;
  undefined8 in_R9;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar51 [16];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined4 uVar93;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float t1;
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vfloat4 b0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vfloat4 a0_3;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vfloat4 a0_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar194;
  float fVar196;
  vfloat4 a0_1;
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar210;
  float fVar211;
  vfloat4 a0;
  float fVar212;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  undefined4 local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar221 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  fVar202 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar73._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar100 = fVar202 * auVar73._16_4_;
  fVar92 = fVar202 * (ray->dir).field_0.m128[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar61 = vpmovsxbd_avx2(auVar36);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar59 = vpmovsxbd_avx2(auVar48);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar66 = vpmovsxbd_avx2(auVar47);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar76 = vpmovsxbd_avx2(auVar46);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar28 * 0xc + 6);
  auVar77 = vpmovsxbd_avx2(auVar45);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar28 * 0xd + 6);
  auVar60 = vpmovsxbd_avx2(auVar44);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar28 * 0x12 + 6);
  auVar67 = vpmovsxbd_avx2(auVar43);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar28 * 0x13 + 6);
  auVar68 = vpmovsxbd_avx2(auVar42);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar28 * 0x14 + 6);
  auVar70 = vpmovsxbd_avx2(auVar39);
  auVar69 = vcvtdq2ps_avx(auVar70);
  auVar136._4_4_ = fVar92;
  auVar136._0_4_ = fVar92;
  auVar136._8_4_ = fVar92;
  auVar136._12_4_ = fVar92;
  auVar136._16_4_ = fVar92;
  auVar136._20_4_ = fVar92;
  auVar136._24_4_ = fVar92;
  auVar136._28_4_ = fVar92;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar58 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar92))));
  auVar71 = vpermps_avx2(auVar227,auVar58);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar57 = vpermps_avx512vl(auVar56,auVar58);
  fVar92 = auVar57._0_4_;
  auVar228._0_4_ = fVar92 * auVar66._0_4_;
  fVar195 = auVar57._4_4_;
  auVar228._4_4_ = fVar195 * auVar66._4_4_;
  fVar197 = auVar57._8_4_;
  auVar228._8_4_ = fVar197 * auVar66._8_4_;
  fVar199 = auVar57._12_4_;
  auVar228._12_4_ = fVar199 * auVar66._12_4_;
  fVar200 = auVar57._16_4_;
  auVar228._16_4_ = fVar200 * auVar66._16_4_;
  fVar201 = auVar57._20_4_;
  auVar228._20_4_ = fVar201 * auVar66._20_4_;
  fVar98 = auVar57._24_4_;
  auVar228._28_36_ = in_ZMM4._28_36_;
  auVar228._24_4_ = fVar98 * auVar66._24_4_;
  auVar58._4_4_ = auVar60._4_4_ * fVar195;
  auVar58._0_4_ = auVar60._0_4_ * fVar92;
  auVar58._8_4_ = auVar60._8_4_ * fVar197;
  auVar58._12_4_ = auVar60._12_4_ * fVar199;
  auVar58._16_4_ = auVar60._16_4_ * fVar200;
  auVar58._20_4_ = auVar60._20_4_ * fVar201;
  auVar58._24_4_ = auVar60._24_4_ * fVar98;
  auVar58._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar69._4_4_ * fVar195;
  auVar70._0_4_ = auVar69._0_4_ * fVar92;
  auVar70._8_4_ = auVar69._8_4_ * fVar197;
  auVar70._12_4_ = auVar69._12_4_ * fVar199;
  auVar70._16_4_ = auVar69._16_4_ * fVar200;
  auVar70._20_4_ = auVar69._20_4_ * fVar201;
  auVar70._24_4_ = auVar69._24_4_ * fVar98;
  auVar70._28_4_ = auVar57._28_4_;
  auVar36 = vfmadd231ps_fma(auVar228._0_32_,auVar71,auVar59);
  auVar48 = vfmadd231ps_fma(auVar58,auVar71,auVar77);
  auVar47 = vfmadd231ps_fma(auVar70,auVar68,auVar71);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar136,auVar61);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar136,auVar76);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar67,auVar136);
  auVar217._4_4_ = fVar100;
  auVar217._0_4_ = fVar100;
  auVar217._8_4_ = fVar100;
  auVar217._12_4_ = fVar100;
  auVar217._16_4_ = fVar100;
  auVar217._20_4_ = fVar100;
  auVar217._24_4_ = fVar100;
  auVar217._28_4_ = fVar100;
  auVar71 = ZEXT1632(CONCAT412(fVar202 * auVar73._28_4_,
                               CONCAT48(fVar202 * auVar73._24_4_,
                                        CONCAT44(fVar202 * auVar73._20_4_,fVar100))));
  auVar70 = vpermps_avx2(auVar227,auVar71);
  auVar58 = vpermps_avx512vl(auVar56,auVar71);
  fVar202 = auVar58._0_4_;
  fVar92 = auVar58._4_4_;
  auVar71._4_4_ = fVar92 * auVar66._4_4_;
  auVar71._0_4_ = fVar202 * auVar66._0_4_;
  fVar195 = auVar58._8_4_;
  auVar71._8_4_ = fVar195 * auVar66._8_4_;
  fVar197 = auVar58._12_4_;
  auVar71._12_4_ = fVar197 * auVar66._12_4_;
  fVar199 = auVar58._16_4_;
  auVar71._16_4_ = fVar199 * auVar66._16_4_;
  fVar200 = auVar58._20_4_;
  auVar71._20_4_ = fVar200 * auVar66._20_4_;
  fVar201 = auVar58._24_4_;
  auVar71._24_4_ = fVar201 * auVar66._24_4_;
  auVar71._28_4_ = 1;
  auVar56._4_4_ = auVar60._4_4_ * fVar92;
  auVar56._0_4_ = auVar60._0_4_ * fVar202;
  auVar56._8_4_ = auVar60._8_4_ * fVar195;
  auVar56._12_4_ = auVar60._12_4_ * fVar197;
  auVar56._16_4_ = auVar60._16_4_ * fVar199;
  auVar56._20_4_ = auVar60._20_4_ * fVar200;
  auVar56._24_4_ = auVar60._24_4_ * fVar201;
  auVar56._28_4_ = auVar66._28_4_;
  auVar60._4_4_ = auVar69._4_4_ * fVar92;
  auVar60._0_4_ = auVar69._0_4_ * fVar202;
  auVar60._8_4_ = auVar69._8_4_ * fVar195;
  auVar60._12_4_ = auVar69._12_4_ * fVar197;
  auVar60._16_4_ = auVar69._16_4_ * fVar199;
  auVar60._20_4_ = auVar69._20_4_ * fVar200;
  auVar60._24_4_ = auVar69._24_4_ * fVar201;
  auVar60._28_4_ = auVar58._28_4_;
  auVar46 = vfmadd231ps_fma(auVar71,auVar70,auVar59);
  auVar45 = vfmadd231ps_fma(auVar56,auVar70,auVar77);
  auVar44 = vfmadd231ps_fma(auVar60,auVar70,auVar68);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar217,auVar61);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar217,auVar76);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar217,auVar67);
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  auVar79._16_4_ = 0x7fffffff;
  auVar79._20_4_ = 0x7fffffff;
  auVar79._24_4_ = 0x7fffffff;
  auVar79._28_4_ = 0x7fffffff;
  auVar61 = vandps_avx(ZEXT1632(auVar36),auVar79);
  auVar123._8_4_ = 0x219392ef;
  auVar123._0_8_ = 0x219392ef219392ef;
  auVar123._12_4_ = 0x219392ef;
  auVar123._16_4_ = 0x219392ef;
  auVar123._20_4_ = 0x219392ef;
  auVar123._24_4_ = 0x219392ef;
  auVar123._28_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar61,auVar123,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar57._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._12_4_;
  auVar57._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar57._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar57._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar57._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar48),auVar79);
  uVar29 = vcmpps_avx512vl(auVar61,auVar123,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar72._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar48._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar48._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar48._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar48._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar47),auVar79);
  uVar29 = vcmpps_avx512vl(auVar61,auVar123,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar61._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar47._12_4_;
  auVar61._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar61._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar61._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar61._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar59 = vrcp14ps_avx512vl(auVar57);
  auVar80._8_4_ = 0x3f800000;
  auVar80._0_8_ = 0x3f8000003f800000;
  auVar80._12_4_ = 0x3f800000;
  auVar80._16_4_ = 0x3f800000;
  auVar80._20_4_ = 0x3f800000;
  auVar80._24_4_ = 0x3f800000;
  auVar80._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar57,auVar59,auVar80);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar72);
  auVar48 = vfnmadd213ps_fma(auVar72,auVar59,auVar80);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar61);
  auVar47 = vfnmadd213ps_fma(auVar61,auVar59,auVar80);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar59,auVar59);
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar46));
  auVar67._4_4_ = auVar36._4_4_ * auVar61._4_4_;
  auVar67._0_4_ = auVar36._0_4_ * auVar61._0_4_;
  auVar67._8_4_ = auVar36._8_4_ * auVar61._8_4_;
  auVar67._12_4_ = auVar36._12_4_ * auVar61._12_4_;
  auVar67._16_4_ = auVar61._16_4_ * 0.0;
  auVar67._20_4_ = auVar61._20_4_ * 0.0;
  auVar67._24_4_ = auVar61._24_4_ * 0.0;
  auVar67._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar46));
  auVar78._0_4_ = auVar36._0_4_ * auVar61._0_4_;
  auVar78._4_4_ = auVar36._4_4_ * auVar61._4_4_;
  auVar78._8_4_ = auVar36._8_4_ * auVar61._8_4_;
  auVar78._12_4_ = auVar36._12_4_ * auVar61._12_4_;
  auVar78._16_4_ = auVar61._16_4_ * 0.0;
  auVar78._20_4_ = auVar61._20_4_ * 0.0;
  auVar78._24_4_ = auVar61._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0xe + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar45));
  auVar60 = vpbroadcastd_avx512vl();
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar68._4_4_ = auVar48._4_4_ * auVar61._4_4_;
  auVar68._0_4_ = auVar48._0_4_ * auVar61._0_4_;
  auVar68._8_4_ = auVar48._8_4_ * auVar61._8_4_;
  auVar68._12_4_ = auVar48._12_4_ * auVar61._12_4_;
  auVar68._16_4_ = auVar61._16_4_ * 0.0;
  auVar68._20_4_ = auVar61._20_4_ * 0.0;
  auVar68._24_4_ = auVar61._24_4_ * 0.0;
  auVar68._28_4_ = auVar61._28_4_;
  auVar61 = vcvtdq2ps_avx(auVar59);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar45));
  auVar75._0_4_ = auVar48._0_4_ * auVar61._0_4_;
  auVar75._4_4_ = auVar48._4_4_ * auVar61._4_4_;
  auVar75._8_4_ = auVar48._8_4_ * auVar61._8_4_;
  auVar75._12_4_ = auVar48._12_4_ * auVar61._12_4_;
  auVar75._16_4_ = auVar61._16_4_ * 0.0;
  auVar75._20_4_ = auVar61._20_4_ * 0.0;
  auVar75._24_4_ = auVar61._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x15 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar44));
  auVar69._4_4_ = auVar61._4_4_ * auVar47._4_4_;
  auVar69._0_4_ = auVar61._0_4_ * auVar47._0_4_;
  auVar69._8_4_ = auVar61._8_4_ * auVar47._8_4_;
  auVar69._12_4_ = auVar61._12_4_ * auVar47._12_4_;
  auVar69._16_4_ = auVar61._16_4_ * 0.0;
  auVar69._20_4_ = auVar61._20_4_ * 0.0;
  auVar69._24_4_ = auVar61._24_4_ * 0.0;
  auVar69._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar44));
  auVar74._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar74._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar74._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar74._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar74._16_4_ = auVar61._16_4_ * 0.0;
  auVar74._20_4_ = auVar61._20_4_ * 0.0;
  auVar74._24_4_ = auVar61._24_4_ * 0.0;
  auVar74._28_4_ = 0;
  auVar61 = vpminsd_avx2(auVar67,auVar78);
  auVar59 = vpminsd_avx2(auVar68,auVar75);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59 = vpminsd_avx2(auVar69,auVar74);
  uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar66._4_4_ = uVar93;
  auVar66._0_4_ = uVar93;
  auVar66._8_4_ = uVar93;
  auVar66._12_4_ = uVar93;
  auVar66._16_4_ = uVar93;
  auVar66._20_4_ = uVar93;
  auVar66._24_4_ = uVar93;
  auVar66._28_4_ = uVar93;
  auVar59 = vmaxps_avx512vl(auVar59,auVar66);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  auVar59._16_4_ = 0x3f7ffffa;
  auVar59._20_4_ = 0x3f7ffffa;
  auVar59._24_4_ = 0x3f7ffffa;
  auVar59._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar61,auVar59);
  auVar61 = vpmaxsd_avx2(auVar67,auVar78);
  auVar59 = vpmaxsd_avx2(auVar68,auVar75);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar59 = vpmaxsd_avx2(auVar69,auVar74);
  fVar202 = ray->tfar;
  auVar76._4_4_ = fVar202;
  auVar76._0_4_ = fVar202;
  auVar76._8_4_ = fVar202;
  auVar76._12_4_ = fVar202;
  auVar76._16_4_ = fVar202;
  auVar76._20_4_ = fVar202;
  auVar76._24_4_ = fVar202;
  auVar76._28_4_ = fVar202;
  auVar59 = vminps_avx512vl(auVar59,auVar76);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar77._8_4_ = 0x3f800003;
  auVar77._0_8_ = 0x3f8000033f800003;
  auVar77._12_4_ = 0x3f800003;
  auVar77._16_4_ = 0x3f800003;
  auVar77._20_4_ = 0x3f800003;
  auVar77._24_4_ = 0x3f800003;
  auVar77._28_4_ = 0x3f800003;
  auVar61 = vmulps_avx512vl(auVar61,auVar77);
  uVar9 = vcmpps_avx512vl(local_78,auVar61,2);
  uVar10 = vpcmpgtd_avx512vl(auVar60,_DAT_01fb4ba0);
  uVar29 = CONCAT44((int)((ulong)in_R9 >> 0x20),(uint)(byte)((byte)uVar9 & (byte)uVar10));
  auVar73._16_16_ = auVar61._16_16_;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar239 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar228 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar36);
  auVar237 = ZEXT464(0x3f800000);
  local_250 = prim;
LAB_019f587f:
  if (uVar29 == 0) {
LAB_019f7305:
    return uVar29 != 0;
  }
  lVar24 = 0;
  for (uVar28 = uVar29; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  local_310 = (ulong)*(uint *)(local_250 + 2);
  local_258 = (ulong)*(uint *)(local_250 + lVar24 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_258);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar36 = *(undefined1 (*) [16])(_Var8 + uVar27 * (long)pvVar7);
  auVar48 = *(undefined1 (*) [16])(_Var8 + (uVar27 + 1) * (long)pvVar7);
  auVar47 = *(undefined1 (*) [16])(_Var8 + (uVar27 + 2) * (long)pvVar7);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar27 + 3));
  lVar24 = *(long *)&pGVar5[1].time_range.upper;
  auVar45 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * uVar27);
  auVar44 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 2));
  uVar28 = uVar29 - 1 & uVar29;
  auVar42 = *(undefined1 (*) [16])(lVar24 + (long)p_Var6 * (uVar27 + 3));
  if (uVar28 != 0) {
    uVar30 = uVar28 - 1 & uVar28;
    for (uVar27 = uVar28; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar30 != 0) {
      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar37 = vmulps_avx512vl(auVar42,auVar63._0_16_);
  auVar55 = auVar239._0_16_;
  auVar39 = vfmadd213ps_fma(auVar55,auVar43,auVar37);
  auVar213._8_4_ = 0x3f2aaaab;
  auVar213._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar213._12_4_ = 0x3f2aaaab;
  auVar39 = vfmadd231ps_fma(auVar39,auVar44,auVar213);
  auVar38 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar55);
  auVar51 = auVar228._0_16_;
  auVar39 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar51);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar44,auVar63._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar39,auVar45,auVar51);
  auVar40 = vmulps_avx512vl(auVar46,auVar63._0_16_);
  auVar39 = vfmadd213ps_fma(auVar55,auVar47,auVar40);
  auVar39 = vfmadd231ps_fma(auVar39,auVar48,auVar213);
  auVar41 = vfmadd231ps_avx512vl(auVar39,auVar36,auVar55);
  auVar39 = vfmadd231ps_avx512vl(auVar40,auVar47,auVar51);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar48,auVar63._0_16_);
  auVar40 = vfnmadd231ps_avx512vl(auVar39,auVar36,auVar51);
  auVar39 = vmulps_avx512vl(auVar42,auVar55);
  auVar39 = vfmadd231ps_fma(auVar39,auVar43,auVar213);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar44,auVar55);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar63._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar51);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar63._0_16_,auVar43);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar51,auVar44);
  auVar43 = vfnmadd231ps_avx512vl(auVar44,auVar63._0_16_,auVar45);
  auVar45 = vmulps_avx512vl(auVar46,auVar55);
  auVar45 = vfmadd231ps_fma(auVar45,auVar47,auVar213);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar55);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar36,auVar63._0_16_);
  auVar46 = vmulps_avx512vl(auVar46,auVar51);
  auVar47 = vfmadd231ps_avx512vl(auVar46,auVar63._0_16_,auVar47);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar51,auVar48);
  auVar44 = vfnmadd231ps_avx512vl(auVar48,auVar63._0_16_,auVar36);
  auVar36 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar48 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar199 = auVar37._0_4_;
  auVar125._0_4_ = fVar199 * auVar48._0_4_;
  fVar200 = auVar37._4_4_;
  auVar125._4_4_ = fVar200 * auVar48._4_4_;
  fVar201 = auVar37._8_4_;
  auVar125._8_4_ = fVar201 * auVar48._8_4_;
  fVar98 = auVar37._12_4_;
  auVar125._12_4_ = fVar98 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar125,auVar36,auVar41);
  auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar126._0_4_ = fVar199 * auVar48._0_4_;
  auVar126._4_4_ = fVar200 * auVar48._4_4_;
  auVar126._8_4_ = fVar201 * auVar48._8_4_;
  auVar126._12_4_ = fVar98 * auVar48._12_4_;
  auVar36 = vfmsub231ps_fma(auVar126,auVar36,auVar40);
  auVar46 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar48 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar100 = auVar43._0_4_;
  auVar117._0_4_ = fVar100 * auVar48._0_4_;
  fVar114 = auVar43._4_4_;
  auVar117._4_4_ = fVar114 * auVar48._4_4_;
  fVar115 = auVar43._8_4_;
  auVar117._8_4_ = fVar115 * auVar48._8_4_;
  fVar116 = auVar43._12_4_;
  auVar117._12_4_ = fVar116 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar117,auVar36,auVar45);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar156._0_4_ = auVar48._0_4_ * fVar100;
  auVar156._4_4_ = auVar48._4_4_ * fVar114;
  auVar156._8_4_ = auVar48._8_4_ * fVar115;
  auVar156._12_4_ = auVar48._12_4_ * fVar116;
  auVar36 = vfmsub231ps_fma(auVar156,auVar36,auVar44);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar92 = auVar36._0_4_;
  auVar63._16_16_ = auVar73._16_16_;
  auVar62._4_28_ = auVar63._4_28_;
  auVar62._0_4_ = fVar92;
  auVar48 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  fVar202 = auVar48._0_4_;
  fVar202 = fVar202 * 1.5 + fVar92 * -0.5 * fVar202 * fVar202 * fVar202;
  auVar48 = vdpps_avx(auVar47,auVar46,0x7f);
  fVar203 = fVar202 * auVar47._0_4_;
  fVar210 = fVar202 * auVar47._4_4_;
  fVar211 = fVar202 * auVar47._8_4_;
  fVar212 = fVar202 * auVar47._12_4_;
  auVar164._0_4_ = auVar46._0_4_ * fVar92;
  auVar164._4_4_ = auVar46._4_4_ * fVar92;
  auVar164._8_4_ = auVar46._8_4_ * fVar92;
  auVar164._12_4_ = auVar46._12_4_ * fVar92;
  fVar92 = auVar48._0_4_;
  auVar139._0_4_ = fVar92 * auVar47._0_4_;
  auVar139._4_4_ = fVar92 * auVar47._4_4_;
  auVar139._8_4_ = fVar92 * auVar47._8_4_;
  auVar139._12_4_ = fVar92 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar164,auVar139);
  auVar48 = vrcp14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar48,ZEXT416(0x40000000));
  fVar195 = auVar48._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar197 = auVar36._0_4_;
  auVar65._16_16_ = auVar73._16_16_;
  auVar65._0_16_ = auVar63._0_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = fVar197;
  auVar48 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  fVar92 = auVar48._0_4_;
  fVar92 = fVar92 * 1.5 + fVar197 * -0.5 * fVar92 * fVar92 * fVar92;
  auVar48 = vdpps_avx(auVar45,auVar44,0x7f);
  fVar183 = fVar92 * auVar45._0_4_;
  fVar194 = fVar92 * auVar45._4_4_;
  fVar196 = fVar92 * auVar45._8_4_;
  fVar198 = fVar92 * auVar45._12_4_;
  auVar127._0_4_ = fVar197 * auVar44._0_4_;
  auVar127._4_4_ = fVar197 * auVar44._4_4_;
  auVar127._8_4_ = fVar197 * auVar44._8_4_;
  auVar127._12_4_ = fVar197 * auVar44._12_4_;
  fVar197 = auVar48._0_4_;
  auVar118._0_4_ = fVar197 * auVar45._0_4_;
  auVar118._4_4_ = fVar197 * auVar45._4_4_;
  auVar118._8_4_ = fVar197 * auVar45._8_4_;
  auVar118._12_4_ = fVar197 * auVar45._12_4_;
  auVar46 = vsubps_avx(auVar127,auVar118);
  auVar48 = vrcp14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar48,ZEXT416(0x40000000));
  fVar197 = auVar48._0_4_ * auVar36._0_4_;
  auVar36 = vshufps_avx(auVar38,auVar38,0xff);
  auVar146._0_4_ = fVar203 * auVar36._0_4_;
  auVar146._4_4_ = fVar210 * auVar36._4_4_;
  auVar146._8_4_ = fVar211 * auVar36._8_4_;
  auVar146._12_4_ = fVar212 * auVar36._12_4_;
  local_1a8 = vsubps_avx(auVar38,auVar146);
  auVar48 = vshufps_avx(auVar37,auVar37,0xff);
  auVar128._0_4_ = auVar48._0_4_ * fVar203 + auVar36._0_4_ * fVar202 * auVar47._0_4_ * fVar195;
  auVar128._4_4_ = auVar48._4_4_ * fVar210 + auVar36._4_4_ * fVar202 * auVar47._4_4_ * fVar195;
  auVar128._8_4_ = auVar48._8_4_ * fVar211 + auVar36._8_4_ * fVar202 * auVar47._8_4_ * fVar195;
  auVar128._12_4_ = auVar48._12_4_ * fVar212 + auVar36._12_4_ * fVar202 * auVar47._12_4_ * fVar195;
  auVar47 = vsubps_avx(auVar37,auVar128);
  local_1b8._0_4_ = auVar38._0_4_ + auVar146._0_4_;
  local_1b8._4_4_ = auVar38._4_4_ + auVar146._4_4_;
  fStack_1b0 = auVar38._8_4_ + auVar146._8_4_;
  fStack_1ac = auVar38._12_4_ + auVar146._12_4_;
  auVar36 = vshufps_avx(auVar39,auVar39,0xff);
  auVar129._0_4_ = fVar183 * auVar36._0_4_;
  auVar129._4_4_ = fVar194 * auVar36._4_4_;
  auVar129._8_4_ = fVar196 * auVar36._8_4_;
  auVar129._12_4_ = fVar198 * auVar36._12_4_;
  local_1c8 = vsubps_avx(auVar39,auVar129);
  auVar48 = vshufps_avx(auVar43,auVar43,0xff);
  auVar51._0_4_ = fVar183 * auVar48._0_4_ + auVar36._0_4_ * fVar92 * auVar46._0_4_ * fVar197;
  auVar51._4_4_ = fVar194 * auVar48._4_4_ + auVar36._4_4_ * fVar92 * auVar46._4_4_ * fVar197;
  auVar51._8_4_ = fVar196 * auVar48._8_4_ + auVar36._8_4_ * fVar92 * auVar46._8_4_ * fVar197;
  auVar51._12_4_ = fVar198 * auVar48._12_4_ + auVar36._12_4_ * fVar92 * auVar46._12_4_ * fVar197;
  auVar36 = vsubps_avx(auVar43,auVar51);
  _local_1d8 = vaddps_avx512vl(auVar39,auVar129);
  auVar50._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar50._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar50._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar50._12_4_ = auVar47._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar50);
  auVar52._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar36._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar52);
  auVar38._0_4_ = (fVar199 + auVar128._0_4_) * 0.33333334;
  auVar38._4_4_ = (fVar200 + auVar128._4_4_) * 0.33333334;
  auVar38._8_4_ = (fVar201 + auVar128._8_4_) * 0.33333334;
  auVar38._12_4_ = (fVar98 + auVar128._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar38);
  auVar40._0_4_ = (fVar100 + auVar51._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar114 + auVar51._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar115 + auVar51._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar116 + auVar51._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar40);
  aVar1 = (ray->org).field_0;
  auVar48 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar55._4_4_ = uVar93;
  auVar55._0_4_ = uVar93;
  auVar55._8_4_ = uVar93;
  auVar55._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar92 = (pre->ray_space).vz.field_0.m128[1];
  fVar195 = (pre->ray_space).vz.field_0.m128[2];
  fVar197 = (pre->ray_space).vz.field_0.m128[3];
  auVar41._0_4_ = fVar202 * auVar48._0_4_;
  auVar41._4_4_ = fVar92 * auVar48._4_4_;
  auVar41._8_4_ = fVar195 * auVar48._8_4_;
  auVar41._12_4_ = fVar197 * auVar48._12_4_;
  auVar36 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar36);
  auVar45 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar55);
  auVar48 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar53._4_4_ = uVar93;
  auVar53._0_4_ = uVar93;
  auVar53._8_4_ = uVar93;
  auVar53._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar49._0_4_ = fVar202 * auVar48._0_4_;
  auVar49._4_4_ = fVar92 * auVar48._4_4_;
  auVar49._8_4_ = fVar195 * auVar48._8_4_;
  auVar49._12_4_ = fVar197 * auVar48._12_4_;
  auVar36 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar3,auVar36);
  auVar44 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar53);
  auVar48 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar147._4_4_ = uVar93;
  auVar147._0_4_ = uVar93;
  auVar147._8_4_ = uVar93;
  auVar147._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar54._0_4_ = fVar202 * auVar48._0_4_;
  auVar54._4_4_ = fVar92 * auVar48._4_4_;
  auVar54._8_4_ = fVar195 * auVar48._8_4_;
  auVar54._12_4_ = fVar197 * auVar48._12_4_;
  auVar36 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar147);
  auVar48 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar157._4_4_ = uVar93;
  auVar157._0_4_ = uVar93;
  auVar157._8_4_ = uVar93;
  auVar157._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar148._0_4_ = fVar202 * auVar48._0_4_;
  auVar148._4_4_ = fVar92 * auVar48._4_4_;
  auVar148._8_4_ = fVar195 * auVar48._8_4_;
  auVar148._12_4_ = fVar197 * auVar48._12_4_;
  auVar36 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar3,auVar36);
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar157);
  auVar48 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar165._4_4_ = uVar93;
  auVar165._0_4_ = uVar93;
  auVar165._8_4_ = uVar93;
  auVar165._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar158._0_4_ = auVar48._0_4_ * fVar202;
  auVar158._4_4_ = auVar48._4_4_ * fVar92;
  auVar158._8_4_ = auVar48._8_4_ * fVar195;
  auVar158._12_4_ = auVar48._12_4_ * fVar197;
  auVar36 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar3,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar165);
  auVar48 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar176._4_4_ = uVar93;
  auVar176._0_4_ = uVar93;
  auVar176._8_4_ = uVar93;
  auVar176._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar166._0_4_ = auVar48._0_4_ * fVar202;
  auVar166._4_4_ = auVar48._4_4_ * fVar92;
  auVar166._8_4_ = auVar48._8_4_ * fVar195;
  auVar166._12_4_ = auVar48._12_4_ * fVar197;
  auVar36 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar3,auVar36);
  auVar73._16_16_ = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar176);
  auVar48 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar184._4_4_ = uVar93;
  auVar184._0_4_ = uVar93;
  auVar184._8_4_ = uVar93;
  auVar184._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar177._0_4_ = auVar48._0_4_ * fVar202;
  auVar177._4_4_ = auVar48._4_4_ * fVar92;
  auVar177._8_4_ = auVar48._8_4_ * fVar195;
  auVar177._12_4_ = auVar48._12_4_ * fVar197;
  auVar36 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar3,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar184);
  auVar48 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar93 = auVar48._0_4_;
  auVar185._4_4_ = uVar93;
  auVar185._0_4_ = uVar93;
  auVar185._8_4_ = uVar93;
  auVar185._12_4_ = uVar93;
  auVar36 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar119._0_4_ = fVar202 * auVar48._0_4_;
  auVar119._4_4_ = fVar92 * auVar48._4_4_;
  auVar119._8_4_ = fVar195 * auVar48._8_4_;
  auVar119._12_4_ = fVar197 * auVar48._12_4_;
  auVar36 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar3,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar185);
  local_308 = vmovlhps_avx512f(auVar45,auVar39);
  auVar235 = ZEXT1664(local_308);
  local_268 = vmovlhps_avx(auVar44,auVar73._16_16_);
  local_278 = vmovlhps_avx512f(auVar43,auVar37);
  _local_108 = vmovlhps_avx512f(auVar42,auVar38);
  auVar36 = vminps_avx512vl(local_308,local_268);
  auVar47 = vmaxps_avx512vl(local_308,local_268);
  auVar48 = vminps_avx512vl(local_278,_local_108);
  auVar48 = vminps_avx(auVar36,auVar48);
  auVar36 = vmaxps_avx512vl(local_278,_local_108);
  auVar36 = vmaxps_avx(auVar47,auVar36);
  auVar47 = vshufpd_avx(auVar48,auVar48,3);
  auVar46 = vshufpd_avx(auVar36,auVar36,3);
  auVar48 = vminps_avx(auVar48,auVar47);
  auVar36 = vmaxps_avx(auVar36,auVar46);
  auVar48 = vandps_avx512vl(auVar48,auVar229._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar229._0_16_);
  auVar36 = vmaxps_avx(auVar48,auVar36);
  auVar48 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar48,auVar36);
  local_288._8_8_ = auVar45._0_8_;
  local_288._0_8_ = auVar45._0_8_;
  local_298 = vmovddup_avx512vl(auVar44);
  local_2a8 = vmovddup_avx512vl(auVar43);
  local_2b8._0_8_ = auVar42._0_8_;
  local_2b8._8_8_ = local_2b8._0_8_;
  register0x00001348 = auVar39._0_8_;
  local_2c8 = auVar39._0_8_;
  register0x00001388 = auVar73._16_8_;
  local_2d8 = auVar73._16_8_;
  register0x00001408 = auVar37._0_8_;
  local_2e8 = auVar37._0_8_;
  register0x00001448 = auVar38._0_8_;
  local_2f8 = auVar38._0_8_;
  local_118 = ZEXT416((uint)(auVar36._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar36 = vxorps_avx512vl(local_b8._0_16_,auVar230._0_16_);
  local_d8 = vbroadcastss_avx512vl(auVar36);
  local_328 = vsubps_avx512vl(local_268,local_308);
  local_e8 = vsubps_avx512vl(local_278,local_268);
  local_f8 = vsubps_avx512vl(_local_108,local_278);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar31 = false;
  auVar36 = ZEXT816(0x3f80000000000000);
  uVar27 = 0;
  auVar37 = auVar36;
LAB_019f5f5e:
  auVar238 = ZEXT3264(local_b8);
  auVar48 = vshufps_avx(auVar37,auVar37,0x50);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar221._16_4_ = 0x3f800000;
  auVar221._0_16_ = auVar218;
  auVar221._20_4_ = 0x3f800000;
  auVar221._24_4_ = 0x3f800000;
  auVar221._28_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar218,auVar48);
  fVar202 = auVar48._0_4_;
  auVar120._0_4_ = local_2c8._0_4_ * fVar202;
  fVar92 = auVar48._4_4_;
  auVar120._4_4_ = local_2c8._4_4_ * fVar92;
  fVar195 = auVar48._8_4_;
  auVar120._8_4_ = local_2c8._8_4_ * fVar195;
  fVar197 = auVar48._12_4_;
  auVar120._12_4_ = local_2c8._12_4_ * fVar197;
  auVar130._0_4_ = local_2d8._0_4_ * fVar202;
  auVar130._4_4_ = local_2d8._4_4_ * fVar92;
  auVar130._8_4_ = local_2d8._8_4_ * fVar195;
  auVar130._12_4_ = local_2d8._12_4_ * fVar197;
  auVar140._0_4_ = local_2e8._0_4_ * fVar202;
  auVar140._4_4_ = local_2e8._4_4_ * fVar92;
  auVar140._8_4_ = local_2e8._8_4_ * fVar195;
  auVar140._12_4_ = local_2e8._12_4_ * fVar197;
  auVar101._0_4_ = local_2f8._0_4_ * fVar202;
  auVar101._4_4_ = local_2f8._4_4_ * fVar92;
  auVar101._8_4_ = local_2f8._8_4_ * fVar195;
  auVar101._12_4_ = local_2f8._12_4_ * fVar197;
  auVar46 = vfmadd231ps_fma(auVar120,auVar47,local_288);
  auVar45 = vfmadd231ps_avx512vl(auVar130,auVar47,local_298);
  auVar44 = vfmadd231ps_avx512vl(auVar140,auVar47,local_2a8);
  auVar47 = vfmadd231ps_fma(auVar101,local_2b8,auVar47);
  auVar48 = vmovshdup_avx(auVar36);
  fVar92 = auVar36._0_4_;
  fVar202 = (auVar48._0_4_ - fVar92) * 0.04761905;
  auVar163._4_4_ = fVar92;
  auVar163._0_4_ = fVar92;
  auVar163._8_4_ = fVar92;
  auVar163._12_4_ = fVar92;
  auVar163._16_4_ = fVar92;
  auVar163._20_4_ = fVar92;
  auVar163._24_4_ = fVar92;
  auVar163._28_4_ = fVar92;
  auVar112._0_8_ = auVar48._0_8_;
  auVar112._8_8_ = auVar112._0_8_;
  auVar112._16_8_ = auVar112._0_8_;
  auVar112._24_8_ = auVar112._0_8_;
  auVar61 = vsubps_avx(auVar112,auVar163);
  uVar93 = auVar46._0_4_;
  auVar113._4_4_ = uVar93;
  auVar113._0_4_ = uVar93;
  auVar113._8_4_ = uVar93;
  auVar113._12_4_ = uVar93;
  auVar113._16_4_ = uVar93;
  auVar113._20_4_ = uVar93;
  auVar113._24_4_ = uVar93;
  auVar113._28_4_ = uVar93;
  auVar180._8_4_ = 1;
  auVar180._0_8_ = 0x100000001;
  auVar180._12_4_ = 1;
  auVar180._16_4_ = 1;
  auVar180._20_4_ = 1;
  auVar180._24_4_ = 1;
  auVar180._28_4_ = 1;
  auVar76 = ZEXT1632(auVar46);
  auVar59 = vpermps_avx2(auVar180,auVar76);
  auVar66 = vbroadcastss_avx512vl(auVar45);
  auVar77 = ZEXT1632(auVar45);
  auVar60 = vpermps_avx512vl(auVar180,auVar77);
  auVar67 = vbroadcastss_avx512vl(auVar44);
  auVar74 = ZEXT1632(auVar44);
  auVar68 = vpermps_avx512vl(auVar180,auVar74);
  auVar69 = vbroadcastss_avx512vl(auVar47);
  auVar73 = ZEXT1632(auVar47);
  auVar70 = vpermps_avx512vl(auVar180,auVar73);
  auVar181._4_4_ = fVar202;
  auVar181._0_4_ = fVar202;
  auVar181._8_4_ = fVar202;
  auVar181._12_4_ = fVar202;
  auVar181._16_4_ = fVar202;
  auVar181._20_4_ = fVar202;
  auVar181._24_4_ = fVar202;
  auVar181._28_4_ = fVar202;
  auVar71 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar58 = vpermps_avx512vl(auVar71,auVar76);
  auVar155._8_4_ = 3;
  auVar155._0_8_ = 0x300000003;
  auVar155._12_4_ = 3;
  auVar155._16_4_ = 3;
  auVar155._20_4_ = 3;
  auVar155._24_4_ = 3;
  auVar155._28_4_ = 3;
  auVar56 = vpermps_avx512vl(auVar155,auVar76);
  auVar57 = vpermps_avx512vl(auVar71,auVar77);
  auVar76 = vpermps_avx2(auVar155,auVar77);
  auVar72 = vpermps_avx512vl(auVar71,auVar74);
  auVar77 = vpermps_avx2(auVar155,auVar74);
  auVar71 = vpermps_avx512vl(auVar71,auVar73);
  auVar73 = vpermps_avx512vl(auVar155,auVar73);
  auVar48 = vfmadd132ps_fma(auVar61,auVar163,_DAT_01f7b040);
  auVar61 = vsubps_avx(auVar221,ZEXT1632(auVar48));
  auVar74 = vmulps_avx512vl(auVar66,ZEXT1632(auVar48));
  auVar78 = ZEXT1632(auVar48);
  auVar75 = vmulps_avx512vl(auVar60,auVar78);
  auVar47 = vfmadd231ps_fma(auVar74,auVar61,auVar113);
  auVar46 = vfmadd231ps_fma(auVar75,auVar61,auVar59);
  auVar74 = vmulps_avx512vl(auVar67,auVar78);
  auVar75 = vmulps_avx512vl(auVar68,auVar78);
  auVar66 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar66);
  auVar60 = vfmadd231ps_avx512vl(auVar75,auVar61,auVar60);
  auVar74 = vmulps_avx512vl(auVar69,auVar78);
  auVar75 = ZEXT1632(auVar48);
  auVar70 = vmulps_avx512vl(auVar70,auVar75);
  auVar67 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar67);
  auVar68 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar68);
  fVar195 = auVar48._0_4_;
  fVar197 = auVar48._4_4_;
  auVar15._4_4_ = fVar197 * auVar66._4_4_;
  auVar15._0_4_ = fVar195 * auVar66._0_4_;
  fVar199 = auVar48._8_4_;
  auVar15._8_4_ = fVar199 * auVar66._8_4_;
  fVar200 = auVar48._12_4_;
  auVar15._12_4_ = fVar200 * auVar66._12_4_;
  auVar15._16_4_ = auVar66._16_4_ * 0.0;
  auVar15._20_4_ = auVar66._20_4_ * 0.0;
  auVar15._24_4_ = auVar66._24_4_ * 0.0;
  auVar15._28_4_ = fVar92;
  auVar16._4_4_ = fVar197 * auVar60._4_4_;
  auVar16._0_4_ = fVar195 * auVar60._0_4_;
  auVar16._8_4_ = fVar199 * auVar60._8_4_;
  auVar16._12_4_ = fVar200 * auVar60._12_4_;
  auVar16._16_4_ = auVar60._16_4_ * 0.0;
  auVar16._20_4_ = auVar60._20_4_ * 0.0;
  auVar16._24_4_ = auVar60._24_4_ * 0.0;
  auVar16._28_4_ = auVar59._28_4_;
  auVar47 = vfmadd231ps_fma(auVar15,auVar61,ZEXT1632(auVar47));
  auVar46 = vfmadd231ps_fma(auVar16,auVar61,ZEXT1632(auVar46));
  auVar106._0_4_ = fVar195 * auVar67._0_4_;
  auVar106._4_4_ = fVar197 * auVar67._4_4_;
  auVar106._8_4_ = fVar199 * auVar67._8_4_;
  auVar106._12_4_ = fVar200 * auVar67._12_4_;
  auVar106._16_4_ = auVar67._16_4_ * 0.0;
  auVar106._20_4_ = auVar67._20_4_ * 0.0;
  auVar106._24_4_ = auVar67._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar17._4_4_ = fVar197 * auVar68._4_4_;
  auVar17._0_4_ = fVar195 * auVar68._0_4_;
  auVar17._8_4_ = fVar199 * auVar68._8_4_;
  auVar17._12_4_ = fVar200 * auVar68._12_4_;
  auVar17._16_4_ = auVar68._16_4_ * 0.0;
  auVar17._20_4_ = auVar68._20_4_ * 0.0;
  auVar17._24_4_ = auVar68._24_4_ * 0.0;
  auVar17._28_4_ = auVar67._28_4_;
  auVar45 = vfmadd231ps_fma(auVar106,auVar61,auVar66);
  auVar44 = vfmadd231ps_fma(auVar17,auVar61,auVar60);
  auVar18._28_4_ = auVar60._28_4_;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(fVar200 * auVar44._12_4_,
                          CONCAT48(fVar199 * auVar44._8_4_,
                                   CONCAT44(fVar197 * auVar44._4_4_,fVar195 * auVar44._0_4_))));
  auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar45._12_4_,
                                               CONCAT48(fVar199 * auVar45._8_4_,
                                                        CONCAT44(fVar197 * auVar45._4_4_,
                                                                 fVar195 * auVar45._0_4_)))),auVar61
                            ,ZEXT1632(auVar47));
  auVar42 = vfmadd231ps_fma(auVar18,auVar61,ZEXT1632(auVar46));
  auVar59 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar47));
  auVar66 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar46));
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar59 = vmulps_avx512vl(auVar59,auVar60);
  auVar66 = vmulps_avx512vl(auVar66,auVar60);
  auVar175._0_4_ = fVar202 * auVar59._0_4_;
  auVar175._4_4_ = fVar202 * auVar59._4_4_;
  auVar175._8_4_ = fVar202 * auVar59._8_4_;
  auVar175._12_4_ = fVar202 * auVar59._12_4_;
  auVar175._16_4_ = fVar202 * auVar59._16_4_;
  auVar175._20_4_ = fVar202 * auVar59._20_4_;
  auVar175._24_4_ = fVar202 * auVar59._24_4_;
  auVar175._28_4_ = 0;
  auVar59 = vmulps_avx512vl(auVar181,auVar66);
  auVar46 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
  auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar42),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar107._0_4_ = auVar175._0_4_ + auVar43._0_4_;
  auVar107._4_4_ = auVar175._4_4_ + auVar43._4_4_;
  auVar107._8_4_ = auVar175._8_4_ + auVar43._8_4_;
  auVar107._12_4_ = auVar175._12_4_ + auVar43._12_4_;
  auVar107._16_4_ = auVar175._16_4_ + 0.0;
  auVar107._20_4_ = auVar175._20_4_ + 0.0;
  auVar107._24_4_ = auVar175._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar78 = ZEXT1632(auVar46);
  auVar68 = vpermt2ps_avx512vl(auVar175,_DAT_01fb9fc0,auVar78);
  auVar69 = vaddps_avx512vl(ZEXT1632(auVar42),auVar59);
  auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01fb9fc0,auVar78);
  auVar59 = vsubps_avx(auVar66,auVar68);
  auVar68 = vsubps_avx512vl(auVar67,auVar70);
  auVar70 = vmulps_avx512vl(auVar57,auVar75);
  auVar74 = vmulps_avx512vl(auVar76,auVar75);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar58);
  auVar58 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar56);
  auVar56 = vmulps_avx512vl(auVar72,auVar75);
  auVar74 = vmulps_avx512vl(auVar77,auVar75);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar57);
  auVar76 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar76);
  auVar71 = vmulps_avx512vl(auVar71,auVar75);
  auVar57 = vmulps_avx512vl(auVar73,auVar75);
  auVar47 = vfmadd231ps_fma(auVar71,auVar61,auVar72);
  auVar71 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar77);
  auVar57 = vmulps_avx512vl(auVar75,auVar56);
  auVar73 = ZEXT1632(auVar48);
  auVar72 = vmulps_avx512vl(auVar73,auVar76);
  auVar70 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar70);
  auVar58 = vfmadd231ps_avx512vl(auVar72,auVar61,auVar58);
  auVar71 = vmulps_avx512vl(auVar73,auVar71);
  auVar56 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar200 * auVar47._12_4_,
                                          CONCAT48(fVar199 * auVar47._8_4_,
                                                   CONCAT44(fVar197 * auVar47._4_4_,
                                                            fVar195 * auVar47._0_4_)))),auVar61,
                       auVar56);
  auVar76 = vfmadd231ps_avx512vl(auVar71,auVar61,auVar76);
  auVar19._4_4_ = fVar197 * auVar56._4_4_;
  auVar19._0_4_ = fVar195 * auVar56._0_4_;
  auVar19._8_4_ = fVar199 * auVar56._8_4_;
  auVar19._12_4_ = fVar200 * auVar56._12_4_;
  auVar19._16_4_ = auVar56._16_4_ * 0.0;
  auVar19._20_4_ = auVar56._20_4_ * 0.0;
  auVar19._24_4_ = auVar56._24_4_ * 0.0;
  auVar19._28_4_ = auVar77._28_4_;
  auVar77 = vmulps_avx512vl(auVar73,auVar76);
  auVar71 = vfmadd231ps_avx512vl(auVar19,auVar61,auVar70);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar58,auVar61);
  auVar61 = vsubps_avx512vl(auVar56,auVar70);
  auVar76 = vsubps_avx512vl(auVar76,auVar58);
  auVar61 = vmulps_avx512vl(auVar61,auVar60);
  auVar76 = vmulps_avx512vl(auVar76,auVar60);
  fVar92 = fVar202 * auVar61._0_4_;
  fVar195 = fVar202 * auVar61._4_4_;
  auVar20._4_4_ = fVar195;
  auVar20._0_4_ = fVar92;
  fVar197 = fVar202 * auVar61._8_4_;
  auVar20._8_4_ = fVar197;
  fVar199 = fVar202 * auVar61._12_4_;
  auVar20._12_4_ = fVar199;
  fVar200 = fVar202 * auVar61._16_4_;
  auVar20._16_4_ = fVar200;
  fVar201 = fVar202 * auVar61._20_4_;
  auVar20._20_4_ = fVar201;
  fVar202 = fVar202 * auVar61._24_4_;
  auVar20._24_4_ = fVar202;
  auVar20._28_4_ = auVar61._28_4_;
  auVar76 = vmulps_avx512vl(auVar181,auVar76);
  auVar60 = vpermt2ps_avx512vl(auVar71,_DAT_01fb9fc0,auVar78);
  auVar70 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,auVar78);
  auVar182._0_4_ = auVar71._0_4_ + fVar92;
  auVar182._4_4_ = auVar71._4_4_ + fVar195;
  auVar182._8_4_ = auVar71._8_4_ + fVar197;
  auVar182._12_4_ = auVar71._12_4_ + fVar199;
  auVar182._16_4_ = auVar71._16_4_ + fVar200;
  auVar182._20_4_ = auVar71._20_4_ + fVar201;
  auVar182._24_4_ = auVar71._24_4_ + fVar202;
  auVar182._28_4_ = auVar71._28_4_ + auVar61._28_4_;
  auVar61 = vpermt2ps_avx512vl(auVar20,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar58 = vaddps_avx512vl(auVar77,auVar76);
  auVar76 = vpermt2ps_avx512vl(auVar76,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar61 = vsubps_avx(auVar60,auVar61);
  auVar76 = vsubps_avx512vl(auVar70,auVar76);
  in_ZMM17 = ZEXT3264(auVar76);
  auVar123 = ZEXT1632(auVar43);
  auVar56 = vsubps_avx512vl(auVar71,auVar123);
  auVar136 = ZEXT1632(auVar42);
  auVar57 = vsubps_avx512vl(auVar77,auVar136);
  auVar72 = vsubps_avx512vl(auVar60,auVar66);
  auVar56 = vaddps_avx512vl(auVar56,auVar72);
  auVar72 = vsubps_avx512vl(auVar70,auVar67);
  auVar57 = vaddps_avx512vl(auVar57,auVar72);
  auVar72 = vmulps_avx512vl(auVar136,auVar56);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar123,auVar57);
  auVar73 = vmulps_avx512vl(auVar69,auVar56);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar107,auVar57);
  auVar74 = vmulps_avx512vl(auVar68,auVar56);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar57);
  auVar75 = vmulps_avx512vl(auVar67,auVar56);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar66,auVar57);
  auVar78 = vmulps_avx512vl(auVar77,auVar56);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar71,auVar57);
  auVar79 = vmulps_avx512vl(auVar58,auVar56);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar182,auVar57);
  auVar80 = vmulps_avx512vl(auVar76,auVar56);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar61,auVar57);
  auVar56 = vmulps_avx512vl(auVar70,auVar56);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar60,auVar57);
  auVar57 = vminps_avx512vl(auVar72,auVar73);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar74,auVar75);
  auVar57 = vminps_avx512vl(auVar57,auVar73);
  auVar73 = vmaxps_avx512vl(auVar74,auVar75);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar78,auVar79);
  auVar74 = vmaxps_avx512vl(auVar78,auVar79);
  auVar75 = vminps_avx512vl(auVar80,auVar56);
  auVar73 = vminps_avx512vl(auVar73,auVar75);
  auVar57 = vminps_avx512vl(auVar57,auVar73);
  auVar56 = vmaxps_avx512vl(auVar80,auVar56);
  auVar56 = vmaxps_avx512vl(auVar74,auVar56);
  auVar56 = vmaxps_avx512vl(auVar72,auVar56);
  uVar9 = vcmpps_avx512vl(auVar57,local_b8,2);
  uVar10 = vcmpps_avx512vl(auVar56,local_d8,5);
  bVar21 = (byte)uVar9 & (byte)uVar10 & 0x7f;
  if (bVar21 != 0) {
    auVar56 = vsubps_avx512vl(auVar66,auVar123);
    auVar57 = vsubps_avx512vl(auVar67,auVar136);
    auVar72 = vsubps_avx512vl(auVar60,auVar71);
    auVar56 = vaddps_avx512vl(auVar56,auVar72);
    auVar72 = vsubps_avx512vl(auVar70,auVar77);
    auVar57 = vaddps_avx512vl(auVar57,auVar72);
    auVar72 = vmulps_avx512vl(auVar136,auVar56);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar57,auVar123);
    auVar69 = vmulps_avx512vl(auVar69,auVar56);
    auVar69 = vfnmadd213ps_avx512vl(auVar107,auVar57,auVar69);
    auVar68 = vmulps_avx512vl(auVar68,auVar56);
    auVar68 = vfnmadd213ps_avx512vl(auVar59,auVar57,auVar68);
    auVar59 = vmulps_avx512vl(auVar67,auVar56);
    auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar57,auVar66);
    auVar59 = vmulps_avx512vl(auVar77,auVar56);
    auVar77 = vfnmadd231ps_avx512vl(auVar59,auVar57,auVar71);
    auVar59 = vmulps_avx512vl(auVar58,auVar56);
    auVar71 = vfnmadd213ps_avx512vl(auVar182,auVar57,auVar59);
    auVar59 = vmulps_avx512vl(auVar76,auVar56);
    auVar58 = vfnmadd213ps_avx512vl(auVar61,auVar57,auVar59);
    auVar61 = vmulps_avx512vl(auVar70,auVar56);
    auVar60 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar57);
    auVar59 = vminps_avx(auVar72,auVar69);
    auVar61 = vmaxps_avx(auVar72,auVar69);
    auVar66 = vminps_avx(auVar68,auVar67);
    auVar66 = vminps_avx(auVar59,auVar66);
    auVar59 = vmaxps_avx(auVar68,auVar67);
    auVar61 = vmaxps_avx(auVar61,auVar59);
    auVar76 = vminps_avx(auVar77,auVar71);
    auVar59 = vmaxps_avx(auVar77,auVar71);
    auVar77 = vminps_avx(auVar58,auVar60);
    auVar76 = vminps_avx(auVar76,auVar77);
    auVar76 = vminps_avx(auVar66,auVar76);
    auVar66 = vmaxps_avx(auVar58,auVar60);
    auVar59 = vmaxps_avx(auVar59,auVar66);
    auVar61 = vmaxps_avx(auVar61,auVar59);
    uVar9 = vcmpps_avx512vl(auVar61,local_d8,5);
    uVar10 = vcmpps_avx512vl(auVar76,local_b8,2);
    bVar21 = bVar21 & (byte)uVar9 & (byte)uVar10;
    if (bVar21 != 0) {
      auStack_198[uVar27] = (uint)bVar21;
      uVar9 = vmovlps_avx(auVar36);
      (&uStack_98)[uVar27] = uVar9;
      uVar30 = vmovlps_avx(auVar37);
      auStack_58[uVar27] = uVar30;
      uVar27 = (ulong)((int)uVar27 + 1);
    }
  }
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar228 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar36);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT3264(auVar61);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar232 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar233 = ZEXT1664(auVar36);
  auVar234 = ZEXT3264(_DAT_01fb9fe0);
  auVar73._16_16_ = DAT_01fb9fe0._16_16_;
  auVar236 = ZEXT1664(local_328);
LAB_019f645b:
  do {
    do {
      do {
        if ((int)uVar27 == 0) {
          if (bVar31) goto LAB_019f7305;
          fVar202 = ray->tfar;
          auVar14._4_4_ = fVar202;
          auVar14._0_4_ = fVar202;
          auVar14._8_4_ = fVar202;
          auVar14._12_4_ = fVar202;
          auVar14._16_4_ = fVar202;
          auVar14._20_4_ = fVar202;
          auVar14._24_4_ = fVar202;
          auVar14._28_4_ = fVar202;
          uVar9 = vcmpps_avx512vl(local_78,auVar14,2);
          uVar29 = (ulong)((uint)uVar28 & (uint)uVar9);
          goto LAB_019f587f;
        }
        uVar22 = (int)uVar27 - 1;
        uVar23 = (ulong)uVar22;
        uVar4 = auStack_198[uVar23];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = auStack_58[uVar23];
        uVar30 = 0;
        for (uVar26 = (ulong)uVar4; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar30 = uVar30 + 1;
        }
        uVar25 = uVar4 - 1 & uVar4;
        bVar34 = uVar25 == 0;
        auStack_198[uVar23] = uVar25;
        if (bVar34) {
          uVar27 = (ulong)uVar22;
        }
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar30;
        auVar36 = vpunpcklqdq_avx(auVar94,ZEXT416((int)uVar30 + 1));
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar232._0_16_);
        uVar93 = *(undefined4 *)((long)&uStack_98 + uVar23 * 8 + 4);
        auVar11._4_4_ = uVar93;
        auVar11._0_4_ = uVar93;
        auVar11._8_4_ = uVar93;
        auVar11._12_4_ = uVar93;
        auVar48 = vmulps_avx512vl(auVar36,auVar11);
        auVar47 = auVar233._0_16_;
        auVar36 = vsubps_avx512vl(auVar47,auVar36);
        uVar93 = *(undefined4 *)(&uStack_98 + uVar23);
        auVar12._4_4_ = uVar93;
        auVar12._0_4_ = uVar93;
        auVar12._8_4_ = uVar93;
        auVar12._12_4_ = uVar93;
        auVar36 = vfmadd231ps_avx512vl(auVar48,auVar36,auVar12);
        auVar48 = vmovshdup_avx(auVar36);
        fVar202 = auVar48._0_4_ - auVar36._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        if (uVar4 == 0 || bVar34) goto LAB_019f5f5e;
        auVar48 = vshufps_avx(auVar37,auVar37,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        auVar44 = vsubps_avx512vl(auVar47,auVar48);
        fVar92 = auVar48._0_4_;
        auVar131._0_4_ = fVar92 * (float)local_2c8._0_4_;
        fVar195 = auVar48._4_4_;
        auVar131._4_4_ = fVar195 * (float)local_2c8._4_4_;
        fVar197 = auVar48._8_4_;
        auVar131._8_4_ = fVar197 * fStack_2c0;
        fVar199 = auVar48._12_4_;
        auVar131._12_4_ = fVar199 * fStack_2bc;
        auVar141._0_4_ = fVar92 * (float)local_2d8._0_4_;
        auVar141._4_4_ = fVar195 * (float)local_2d8._4_4_;
        auVar141._8_4_ = fVar197 * fStack_2d0;
        auVar141._12_4_ = fVar199 * fStack_2cc;
        auVar149._0_4_ = fVar92 * (float)local_2e8._0_4_;
        auVar149._4_4_ = fVar195 * (float)local_2e8._4_4_;
        auVar149._8_4_ = fVar197 * fStack_2e0;
        auVar149._12_4_ = fVar199 * fStack_2dc;
        auVar108._0_4_ = fVar92 * (float)local_2f8._0_4_;
        auVar108._4_4_ = fVar195 * (float)local_2f8._4_4_;
        auVar108._8_4_ = fVar197 * fStack_2f0;
        auVar108._12_4_ = fVar199 * fStack_2ec;
        auVar48 = vfmadd231ps_fma(auVar131,auVar44,local_288);
        auVar46 = vfmadd231ps_fma(auVar141,auVar44,local_298);
        auVar45 = vfmadd231ps_fma(auVar149,auVar44,local_2a8);
        auVar44 = vfmadd231ps_fma(auVar108,auVar44,local_2b8);
        auVar124._16_16_ = auVar48;
        auVar124._0_16_ = auVar48;
        auVar137._16_16_ = auVar46;
        auVar137._0_16_ = auVar46;
        auVar145._16_16_ = auVar45;
        auVar145._0_16_ = auVar45;
        auVar59 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar36));
        auVar61 = vsubps_avx(auVar137,auVar124);
        auVar46 = vfmadd213ps_fma(auVar61,auVar59,auVar124);
        auVar61 = vsubps_avx(auVar145,auVar137);
        auVar43 = vfmadd213ps_fma(auVar61,auVar59,auVar137);
        auVar48 = vsubps_avx(auVar44,auVar45);
        auVar138._16_16_ = auVar48;
        auVar138._0_16_ = auVar48;
        auVar48 = vfmadd213ps_fma(auVar138,auVar59,auVar145);
        auVar61 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar46));
        auVar46 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar46));
        auVar61 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar43));
        auVar48 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar43));
        auVar61 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar46));
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar61,auVar59);
        auVar61 = vmulps_avx512vl(auVar61,auVar231._0_32_);
        auVar73._16_16_ = auVar61._16_16_;
        fVar92 = fVar202 * 0.33333334;
        auVar150._0_8_ =
             CONCAT44(auVar55._4_4_ + fVar92 * auVar61._4_4_,auVar55._0_4_ + fVar92 * auVar61._0_4_)
        ;
        auVar150._8_4_ = auVar55._8_4_ + fVar92 * auVar61._8_4_;
        auVar150._12_4_ = auVar55._12_4_ + fVar92 * auVar61._12_4_;
        auVar132._0_4_ = fVar92 * auVar61._16_4_;
        auVar132._4_4_ = fVar92 * auVar61._20_4_;
        auVar132._8_4_ = fVar92 * auVar61._24_4_;
        auVar132._12_4_ = fVar92 * auVar61._28_4_;
        auVar40 = vsubps_avx((undefined1  [16])0x0,auVar132);
        auVar43 = vshufpd_avx(auVar55,auVar55,3);
        auVar42 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar48 = vsubps_avx(auVar43,auVar55);
        auVar46 = vsubps_avx(auVar42,(undefined1  [16])0x0);
        auVar167._0_4_ = auVar48._0_4_ + auVar46._0_4_;
        auVar167._4_4_ = auVar48._4_4_ + auVar46._4_4_;
        auVar167._8_4_ = auVar48._8_4_ + auVar46._8_4_;
        auVar167._12_4_ = auVar48._12_4_ + auVar46._12_4_;
        auVar48 = vshufps_avx(auVar55,auVar55,0xb1);
        auVar46 = vshufps_avx(auVar150,auVar150,0xb1);
        auVar45 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar44 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar219._4_4_ = auVar167._0_4_;
        auVar219._0_4_ = auVar167._0_4_;
        auVar219._8_4_ = auVar167._0_4_;
        auVar219._12_4_ = auVar167._0_4_;
        auVar39 = vshufps_avx(auVar167,auVar167,0x55);
        fVar92 = auVar39._0_4_;
        auVar178._0_4_ = auVar48._0_4_ * fVar92;
        fVar195 = auVar39._4_4_;
        auVar178._4_4_ = auVar48._4_4_ * fVar195;
        fVar197 = auVar39._8_4_;
        auVar178._8_4_ = auVar48._8_4_ * fVar197;
        fVar199 = auVar39._12_4_;
        auVar178._12_4_ = auVar48._12_4_ * fVar199;
        auVar186._0_4_ = auVar46._0_4_ * fVar92;
        auVar186._4_4_ = auVar46._4_4_ * fVar195;
        auVar186._8_4_ = auVar46._8_4_ * fVar197;
        auVar186._12_4_ = auVar46._12_4_ * fVar199;
        auVar204._0_4_ = auVar45._0_4_ * fVar92;
        auVar204._4_4_ = auVar45._4_4_ * fVar195;
        auVar204._8_4_ = auVar45._8_4_ * fVar197;
        auVar204._12_4_ = auVar45._12_4_ * fVar199;
        auVar168._0_4_ = auVar44._0_4_ * fVar92;
        auVar168._4_4_ = auVar44._4_4_ * fVar195;
        auVar168._8_4_ = auVar44._8_4_ * fVar197;
        auVar168._12_4_ = auVar44._12_4_ * fVar199;
        auVar48 = vfmadd231ps_fma(auVar178,auVar219,auVar55);
        auVar46 = vfmadd231ps_fma(auVar186,auVar219,auVar150);
        auVar41 = vfmadd231ps_fma(auVar204,auVar219,auVar40);
        auVar51 = vfmadd231ps_fma(auVar168,(undefined1  [16])0x0,auVar219);
        auVar39 = vshufpd_avx(auVar48,auVar48,1);
        auVar38 = vshufpd_avx(auVar46,auVar46,1);
        auVar49 = vshufpd_avx512vl(auVar41,auVar41,1);
        auVar50 = vshufpd_avx512vl(auVar51,auVar51,1);
        in_ZMM17 = ZEXT1664(auVar50);
        auVar45 = vminss_avx(auVar48,auVar46);
        auVar48 = vmaxss_avx(auVar46,auVar48);
        auVar44 = vminss_avx(auVar41,auVar51);
        auVar46 = vmaxss_avx(auVar51,auVar41);
        auVar45 = vminss_avx(auVar45,auVar44);
        auVar48 = vmaxss_avx(auVar46,auVar48);
        auVar44 = vminss_avx(auVar39,auVar38);
        auVar46 = vmaxss_avx(auVar38,auVar39);
        auVar39 = vminss_avx512f(auVar49,auVar50);
        auVar38 = vmaxss_avx512f(auVar50,auVar49);
        auVar46 = vmaxss_avx(auVar38,auVar46);
        auVar44 = vminss_avx512f(auVar44,auVar39);
        fVar195 = auVar46._0_4_;
        fVar92 = auVar48._0_4_;
        if (auVar45._0_4_ < 0.0001) {
          bVar35 = fVar195 == -0.0001;
          bVar32 = NAN(fVar195);
          if (fVar195 <= -0.0001) goto LAB_019f6688;
          break;
        }
LAB_019f6688:
        vucomiss_avx512f(auVar44);
        bVar35 = fVar195 <= -0.0001;
        bVar33 = -0.0001 < fVar92;
        bVar32 = bVar35;
        if (!bVar35) break;
        uVar9 = vcmpps_avx512vl(auVar45,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar10 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar21 = (byte)uVar9 & (byte)uVar10 & 1;
        bVar35 = bVar33 && bVar21 == 0;
        bVar32 = bVar33 && bVar21 == 0;
      } while (!bVar33 || bVar21 != 0);
      auVar41 = vxorps_avx512vl(auVar235._0_16_,auVar235._0_16_);
      vcmpss_avx512f(auVar45,auVar41,1);
      uVar9 = vcmpss_avx512f(auVar48,auVar41,1);
      bVar33 = (bool)((byte)uVar9 & 1);
      auVar73._0_16_ = auVar237._0_16_;
      auVar81._4_28_ = auVar73._4_28_;
      auVar81._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar237._0_4_);
      vucomiss_avx512f(auVar81._0_16_);
      bVar32 = (bool)(!bVar35 | bVar32);
      bVar33 = bVar32 == false;
      auVar83._16_16_ = auVar73._16_16_;
      auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar82._4_28_ = auVar83._4_28_;
      auVar82._0_4_ = (uint)bVar32 * auVar41._0_4_ + (uint)!bVar32 * 0x7f800000;
      auVar38 = auVar82._0_16_;
      auVar85._16_16_ = auVar73._16_16_;
      auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar32 * auVar41._0_4_ + (uint)!bVar32 * -0x800000;
      auVar39 = auVar84._0_16_;
      auVar51 = vxorps_avx512vl(auVar238._0_16_,auVar238._0_16_);
      auVar238 = ZEXT1664(auVar51);
      uVar9 = vcmpss_avx512f(auVar44,auVar41,1);
      bVar35 = (bool)((byte)uVar9 & 1);
      auVar87._16_16_ = auVar73._16_16_;
      auVar87._0_16_ = auVar237._0_16_;
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar237._0_4_);
      auVar44 = vucomiss_avx512f(auVar86._0_16_);
      in_ZMM17 = ZEXT1664(auVar44);
      if ((bVar32) || (bVar33)) {
        auVar44 = vucomiss_avx512f(auVar45);
        if ((bVar32) || (bVar33)) {
          auVar41 = vxorps_avx512vl(auVar45,auVar230._0_16_);
          in_ZMM17 = ZEXT1664(auVar41);
          auVar45 = vsubss_avx512f(auVar44,auVar45);
          auVar45 = vdivss_avx512f(auVar41,auVar45);
          auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar51,auVar45);
          auVar45 = auVar44;
        }
        else {
          auVar45 = vxorps_avx512vl(auVar44,auVar44);
          vucomiss_avx512f(auVar45);
          auVar44 = ZEXT416(0x3f800000);
          if ((bVar32) || (bVar33)) {
            auVar44 = SUB6416(ZEXT464(0xff800000),0);
            auVar45 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar38 = vminss_avx512f(auVar38,auVar45);
        auVar39 = vmaxss_avx(auVar44,auVar39);
      }
      auVar237 = ZEXT464(0x3f800000);
      auVar235 = ZEXT1664(local_308);
      uVar9 = vcmpss_avx512f(auVar46,auVar51,1);
      bVar35 = (bool)((byte)uVar9 & 1);
      auVar46 = auVar237._0_16_;
      fVar197 = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * 0x3f800000);
      if ((auVar81._0_4_ != fVar197) || (NAN(auVar81._0_4_) || NAN(fVar197))) {
        if ((fVar195 != fVar92) || (NAN(fVar195) || NAN(fVar92))) {
          auVar48 = vxorps_avx512vl(auVar48,auVar230._0_16_);
          auVar169._0_4_ = auVar48._0_4_ / (fVar195 - fVar92);
          auVar169._4_12_ = auVar48._4_12_;
          auVar48 = vsubss_avx512f(auVar46,auVar169);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar51,auVar169);
          auVar45 = auVar48;
        }
        else if ((fVar92 != 0.0) ||
                (auVar48 = auVar46, auVar45 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
          auVar48 = SUB6416(ZEXT464(0xff800000),0);
          auVar45 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar38 = vminss_avx(auVar38,auVar45);
        auVar39 = vmaxss_avx(auVar48,auVar39);
      }
      bVar35 = auVar86._0_4_ != fVar197;
      auVar48 = vminss_avx512f(auVar38,auVar46);
      auVar89._16_16_ = auVar73._16_16_;
      auVar89._0_16_ = auVar38;
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (uint)bVar35 * auVar48._0_4_ + (uint)!bVar35 * auVar38._0_4_;
      auVar48 = vmaxss_avx512f(auVar46,auVar39);
      auVar91._16_16_ = auVar73._16_16_;
      auVar91._0_16_ = auVar39;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (uint)bVar35 * auVar48._0_4_ + (uint)!bVar35 * auVar39._0_4_;
      auVar48 = vmaxss_avx512f(auVar51,auVar88._0_16_);
      auVar45 = vminss_avx512f(auVar90._0_16_,auVar46);
    } while (auVar45._0_4_ < auVar48._0_4_);
    auVar41 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar50 = vminss_avx512f(ZEXT416((uint)(auVar45._0_4_ + 0.1)),auVar46);
    auVar109._0_8_ = auVar55._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar187._8_8_ = auVar150._0_8_;
    auVar187._0_8_ = auVar150._0_8_;
    auVar205._8_8_ = auVar40._0_8_;
    auVar205._0_8_ = auVar40._0_8_;
    auVar48 = vshufpd_avx(auVar150,auVar150,3);
    auVar45 = vshufpd_avx(auVar40,auVar40,3);
    auVar44 = vshufps_avx(auVar41,auVar50,0);
    auVar40 = vsubps_avx512vl(auVar47,auVar44);
    fVar92 = auVar44._0_4_;
    auVar142._0_4_ = fVar92 * auVar43._0_4_;
    fVar195 = auVar44._4_4_;
    auVar142._4_4_ = fVar195 * auVar43._4_4_;
    fVar197 = auVar44._8_4_;
    auVar142._8_4_ = fVar197 * auVar43._8_4_;
    fVar199 = auVar44._12_4_;
    auVar142._12_4_ = fVar199 * auVar43._12_4_;
    auVar151._0_4_ = fVar92 * auVar48._0_4_;
    auVar151._4_4_ = fVar195 * auVar48._4_4_;
    auVar151._8_4_ = fVar197 * auVar48._8_4_;
    auVar151._12_4_ = fVar199 * auVar48._12_4_;
    auVar222._0_4_ = auVar45._0_4_ * fVar92;
    auVar222._4_4_ = auVar45._4_4_ * fVar195;
    auVar222._8_4_ = auVar45._8_4_ * fVar197;
    auVar222._12_4_ = auVar45._12_4_ * fVar199;
    auVar133._0_4_ = fVar92 * auVar42._0_4_;
    auVar133._4_4_ = fVar195 * auVar42._4_4_;
    auVar133._8_4_ = fVar197 * auVar42._8_4_;
    auVar133._12_4_ = fVar199 * auVar42._12_4_;
    auVar42 = vfmadd231ps_fma(auVar142,auVar40,auVar109);
    auVar39 = vfmadd231ps_fma(auVar151,auVar40,auVar187);
    auVar38 = vfmadd231ps_fma(auVar222,auVar40,auVar205);
    auVar40 = vfmadd231ps_fma(auVar133,auVar40,ZEXT816(0));
    auVar45 = vsubss_avx512f(auVar46,auVar41);
    auVar48 = vmovshdup_avx(auVar37);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar41._0_4_)),auVar37,auVar45);
    auVar45 = vsubss_avx512f(auVar46,auVar50);
    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar50._0_4_)),auVar37,auVar45);
    auVar37 = vdivss_avx512f(auVar46,ZEXT416((uint)fVar202));
    auVar48 = vsubps_avx(auVar39,auVar42);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar48,auVar41);
    auVar48 = vsubps_avx(auVar38,auVar39);
    auVar43 = vmulps_avx512vl(auVar48,auVar41);
    auVar48 = vsubps_avx(auVar40,auVar38);
    auVar48 = vmulps_avx512vl(auVar48,auVar41);
    auVar45 = vminps_avx(auVar43,auVar48);
    auVar48 = vmaxps_avx(auVar43,auVar48);
    auVar45 = vminps_avx(auVar44,auVar45);
    auVar48 = vmaxps_avx(auVar44,auVar48);
    auVar44 = vshufpd_avx(auVar45,auVar45,3);
    auVar43 = vshufpd_avx(auVar48,auVar48,3);
    auVar45 = vminps_avx(auVar45,auVar44);
    auVar48 = vmaxps_avx(auVar48,auVar43);
    fVar202 = auVar37._0_4_;
    auVar170._0_4_ = auVar45._0_4_ * fVar202;
    auVar170._4_4_ = auVar45._4_4_ * fVar202;
    auVar170._8_4_ = auVar45._8_4_ * fVar202;
    auVar170._12_4_ = auVar45._12_4_ * fVar202;
    auVar159._0_4_ = fVar202 * auVar48._0_4_;
    auVar159._4_4_ = fVar202 * auVar48._4_4_;
    auVar159._8_4_ = fVar202 * auVar48._8_4_;
    auVar159._12_4_ = fVar202 * auVar48._12_4_;
    auVar37 = vdivss_avx512f(auVar46,ZEXT416((uint)(auVar50._0_4_ - auVar49._0_4_)));
    auVar48 = vshufpd_avx(auVar42,auVar42,3);
    auVar45 = vshufpd_avx(auVar39,auVar39,3);
    auVar44 = vshufpd_avx(auVar38,auVar38,3);
    auVar43 = vshufpd_avx(auVar40,auVar40,3);
    auVar48 = vsubps_avx(auVar48,auVar42);
    auVar42 = vsubps_avx(auVar45,auVar39);
    auVar39 = vsubps_avx(auVar44,auVar38);
    auVar43 = vsubps_avx(auVar43,auVar40);
    auVar45 = vminps_avx(auVar48,auVar42);
    auVar48 = vmaxps_avx(auVar48,auVar42);
    auVar44 = vminps_avx(auVar39,auVar43);
    auVar44 = vminps_avx(auVar45,auVar44);
    auVar45 = vmaxps_avx(auVar39,auVar43);
    auVar48 = vmaxps_avx(auVar48,auVar45);
    fVar202 = auVar37._0_4_;
    auVar206._0_4_ = fVar202 * auVar44._0_4_;
    auVar206._4_4_ = fVar202 * auVar44._4_4_;
    auVar206._8_4_ = fVar202 * auVar44._8_4_;
    auVar206._12_4_ = fVar202 * auVar44._12_4_;
    auVar188._0_4_ = fVar202 * auVar48._0_4_;
    auVar188._4_4_ = fVar202 * auVar48._4_4_;
    auVar188._8_4_ = fVar202 * auVar48._8_4_;
    auVar188._12_4_ = fVar202 * auVar48._12_4_;
    auVar43 = vinsertps_avx(auVar36,auVar49,0x10);
    auVar52 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9f90,auVar50);
    auVar99._0_4_ = auVar43._0_4_ + auVar52._0_4_;
    auVar99._4_4_ = auVar43._4_4_ + auVar52._4_4_;
    auVar99._8_4_ = auVar43._8_4_ + auVar52._8_4_;
    auVar99._12_4_ = auVar43._12_4_ + auVar52._12_4_;
    auVar40 = vmulps_avx512vl(auVar99,auVar228._0_16_);
    auVar45 = vshufps_avx(auVar40,auVar40,0x54);
    uVar93 = auVar40._0_4_;
    auVar102._4_4_ = uVar93;
    auVar102._0_4_ = uVar93;
    auVar102._8_4_ = uVar93;
    auVar102._12_4_ = uVar93;
    auVar39 = vfmadd213ps_avx512vl(auVar236._0_16_,auVar102,local_308);
    auVar44 = vfmadd213ps_fma(local_e8,auVar102,local_268);
    auVar42 = vfmadd213ps_fma(local_f8,auVar102,local_278);
    auVar48 = vsubps_avx(auVar44,auVar39);
    auVar39 = vfmadd213ps_fma(auVar48,auVar102,auVar39);
    auVar48 = vsubps_avx(auVar42,auVar44);
    auVar48 = vfmadd213ps_fma(auVar48,auVar102,auVar44);
    auVar48 = vsubps_avx(auVar48,auVar39);
    auVar44 = vfmadd231ps_fma(auVar39,auVar48,auVar102);
    auVar37 = vmulps_avx512vl(auVar48,auVar41);
    auVar214._8_8_ = auVar44._0_8_;
    auVar214._0_8_ = auVar44._0_8_;
    auVar48 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar40,auVar40,0x55);
    auVar42 = vsubps_avx(auVar48,auVar214);
    auVar39 = vfmadd231ps_fma(auVar214,auVar44,auVar42);
    auVar223._8_8_ = auVar37._0_8_;
    auVar223._0_8_ = auVar37._0_8_;
    auVar48 = vshufpd_avx(auVar37,auVar37,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar223);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar44,auVar223);
    auVar103._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar103._8_4_ = auVar42._8_4_ ^ 0x80000000;
    auVar103._12_4_ = auVar42._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar48);
    auVar224._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
    auVar224._8_4_ = auVar44._8_4_ ^ 0x80000000;
    auVar224._12_4_ = auVar44._12_4_ ^ 0x80000000;
    auVar37 = vmovshdup_avx512vl(auVar42);
    auVar38 = vpermt2ps_avx512vl(auVar224,ZEXT416(5),auVar42);
    auVar235 = ZEXT1664(local_308);
    auVar44 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar42._0_4_)),auVar48,auVar37);
    auVar42 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar103);
    auVar134._0_4_ = auVar44._0_4_;
    auVar134._4_4_ = auVar134._0_4_;
    auVar134._8_4_ = auVar134._0_4_;
    auVar134._12_4_ = auVar134._0_4_;
    auVar48 = vdivps_avx(auVar38,auVar134);
    auVar53 = vdivps_avx512vl(auVar42,auVar134);
    fVar202 = auVar39._0_4_;
    auVar44 = vshufps_avx(auVar39,auVar39,0x55);
    auVar215._0_4_ = fVar202 * auVar48._0_4_ + auVar44._0_4_ * auVar53._0_4_;
    auVar215._4_4_ = fVar202 * auVar48._4_4_ + auVar44._4_4_ * auVar53._4_4_;
    auVar215._8_4_ = fVar202 * auVar48._8_4_ + auVar44._8_4_ * auVar53._8_4_;
    auVar215._12_4_ = fVar202 * auVar48._12_4_ + auVar44._12_4_ * auVar53._12_4_;
    auVar41 = vsubps_avx(auVar45,auVar215);
    auVar44 = vmovshdup_avx(auVar48);
    auVar45 = vinsertps_avx(auVar170,auVar206,0x1c);
    auVar225._0_4_ = auVar44._0_4_ * auVar45._0_4_;
    auVar225._4_4_ = auVar44._4_4_ * auVar45._4_4_;
    auVar225._8_4_ = auVar44._8_4_ * auVar45._8_4_;
    auVar225._12_4_ = auVar44._12_4_ * auVar45._12_4_;
    auVar55 = vinsertps_avx512f(auVar159,auVar188,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar55);
    auVar38 = vminps_avx512vl(auVar225,auVar44);
    auVar39 = vmaxps_avx(auVar44,auVar225);
    auVar37 = vmovshdup_avx(auVar53);
    auVar44 = vinsertps_avx(auVar206,auVar170,0x4c);
    auVar207._0_4_ = auVar37._0_4_ * auVar44._0_4_;
    auVar207._4_4_ = auVar37._4_4_ * auVar44._4_4_;
    auVar207._8_4_ = auVar37._8_4_ * auVar44._8_4_;
    auVar207._12_4_ = auVar37._12_4_ * auVar44._12_4_;
    auVar42 = vinsertps_avx(auVar188,auVar159,0x4c);
    auVar189._0_4_ = auVar37._0_4_ * auVar42._0_4_;
    auVar189._4_4_ = auVar37._4_4_ * auVar42._4_4_;
    auVar189._8_4_ = auVar37._8_4_ * auVar42._8_4_;
    auVar189._12_4_ = auVar37._12_4_ * auVar42._12_4_;
    auVar37 = vminps_avx(auVar207,auVar189);
    auVar38 = vaddps_avx512vl(auVar38,auVar37);
    auVar37 = vmaxps_avx(auVar189,auVar207);
    auVar190._0_4_ = auVar39._0_4_ + auVar37._0_4_;
    auVar190._4_4_ = auVar39._4_4_ + auVar37._4_4_;
    auVar190._8_4_ = auVar39._8_4_ + auVar37._8_4_;
    auVar190._12_4_ = auVar39._12_4_ + auVar37._12_4_;
    auVar208._8_8_ = 0x3f80000000000000;
    auVar208._0_8_ = 0x3f80000000000000;
    auVar39 = vsubps_avx(auVar208,auVar190);
    auVar37 = vsubps_avx(auVar208,auVar38);
    auVar38 = vsubps_avx(auVar43,auVar40);
    auVar40 = vsubps_avx(auVar52,auVar40);
    fVar199 = auVar38._0_4_;
    auVar226._0_4_ = fVar199 * auVar39._0_4_;
    fVar200 = auVar38._4_4_;
    auVar226._4_4_ = fVar200 * auVar39._4_4_;
    fVar201 = auVar38._8_4_;
    auVar226._8_4_ = fVar201 * auVar39._8_4_;
    fVar98 = auVar38._12_4_;
    auVar226._12_4_ = fVar98 * auVar39._12_4_;
    auVar54 = vbroadcastss_avx512vl(auVar48);
    auVar45 = vmulps_avx512vl(auVar54,auVar45);
    auVar55 = vmulps_avx512vl(auVar54,auVar55);
    auVar54 = vminps_avx512vl(auVar45,auVar55);
    auVar55 = vmaxps_avx512vl(auVar55,auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar53);
    auVar44 = vmulps_avx512vl(auVar45,auVar44);
    auVar45 = vmulps_avx512vl(auVar45,auVar42);
    auVar42 = vminps_avx512vl(auVar44,auVar45);
    auVar42 = vaddps_avx512vl(auVar54,auVar42);
    auVar38 = vmulps_avx512vl(auVar38,auVar37);
    in_ZMM17 = ZEXT1664(auVar38);
    fVar202 = auVar40._0_4_;
    auVar191._0_4_ = fVar202 * auVar39._0_4_;
    fVar92 = auVar40._4_4_;
    auVar191._4_4_ = fVar92 * auVar39._4_4_;
    fVar195 = auVar40._8_4_;
    auVar191._8_4_ = fVar195 * auVar39._8_4_;
    fVar197 = auVar40._12_4_;
    auVar191._12_4_ = fVar197 * auVar39._12_4_;
    auVar209._0_4_ = fVar202 * auVar37._0_4_;
    auVar209._4_4_ = fVar92 * auVar37._4_4_;
    auVar209._8_4_ = fVar195 * auVar37._8_4_;
    auVar209._12_4_ = fVar197 * auVar37._12_4_;
    auVar45 = vmaxps_avx(auVar45,auVar44);
    auVar160._0_4_ = auVar55._0_4_ + auVar45._0_4_;
    auVar160._4_4_ = auVar55._4_4_ + auVar45._4_4_;
    auVar160._8_4_ = auVar55._8_4_ + auVar45._8_4_;
    auVar160._12_4_ = auVar55._12_4_ + auVar45._12_4_;
    auVar171._8_8_ = 0x3f800000;
    auVar171._0_8_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar171,auVar160);
    auVar44 = vsubps_avx512vl(auVar171,auVar42);
    auVar220._0_4_ = fVar199 * auVar45._0_4_;
    auVar220._4_4_ = fVar200 * auVar45._4_4_;
    auVar220._8_4_ = fVar201 * auVar45._8_4_;
    auVar220._12_4_ = fVar98 * auVar45._12_4_;
    auVar216._0_4_ = fVar199 * auVar44._0_4_;
    auVar216._4_4_ = fVar200 * auVar44._4_4_;
    auVar216._8_4_ = fVar201 * auVar44._8_4_;
    auVar216._12_4_ = fVar98 * auVar44._12_4_;
    auVar161._0_4_ = fVar202 * auVar45._0_4_;
    auVar161._4_4_ = fVar92 * auVar45._4_4_;
    auVar161._8_4_ = fVar195 * auVar45._8_4_;
    auVar161._12_4_ = fVar197 * auVar45._12_4_;
    auVar172._0_4_ = fVar202 * auVar44._0_4_;
    auVar172._4_4_ = fVar92 * auVar44._4_4_;
    auVar172._8_4_ = fVar195 * auVar44._8_4_;
    auVar172._12_4_ = fVar197 * auVar44._12_4_;
    auVar45 = vminps_avx(auVar220,auVar216);
    auVar44 = vminps_avx512vl(auVar161,auVar172);
    auVar42 = vminps_avx512vl(auVar45,auVar44);
    auVar45 = vmaxps_avx(auVar216,auVar220);
    auVar44 = vmaxps_avx(auVar172,auVar161);
    auVar44 = vmaxps_avx(auVar44,auVar45);
    auVar39 = vminps_avx512vl(auVar226,auVar38);
    auVar45 = vminps_avx(auVar191,auVar209);
    auVar45 = vminps_avx(auVar39,auVar45);
    auVar45 = vhaddps_avx(auVar42,auVar45);
    auVar39 = vmaxps_avx512vl(auVar38,auVar226);
    auVar42 = vmaxps_avx(auVar209,auVar191);
    auVar42 = vmaxps_avx(auVar42,auVar39);
    auVar44 = vhaddps_avx(auVar44,auVar42);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar162._0_4_ = auVar45._0_4_ + auVar41._0_4_;
    auVar162._4_4_ = auVar45._4_4_ + auVar41._4_4_;
    auVar162._8_4_ = auVar45._8_4_ + auVar41._8_4_;
    auVar162._12_4_ = auVar45._12_4_ + auVar41._12_4_;
    auVar173._0_4_ = auVar44._0_4_ + auVar41._0_4_;
    auVar173._4_4_ = auVar44._4_4_ + auVar41._4_4_;
    auVar173._8_4_ = auVar44._8_4_ + auVar41._8_4_;
    auVar173._12_4_ = auVar44._12_4_ + auVar41._12_4_;
    auVar45 = vmaxps_avx(auVar43,auVar162);
    auVar44 = vminps_avx(auVar173,auVar52);
    uVar30 = vcmpps_avx512vl(auVar44,auVar45,1);
  } while ((uVar30 & 3) != 0);
  uVar30 = vcmpps_avx512vl(auVar173,auVar52,1);
  uVar9 = vcmpps_avx512vl(auVar36,auVar162,1);
  if (((ushort)uVar9 & (ushort)uVar30 & 1) == 0) {
    bVar21 = 0;
  }
  else {
    auVar45 = vmovshdup_avx(auVar162);
    bVar21 = auVar49._0_4_ < auVar45._0_4_ & (byte)(uVar30 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar27 || uVar4 != 0 && !bVar34) | bVar21) != 1) goto LAB_019f727a;
  lVar24 = 0xc9;
  do {
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) goto LAB_019f645b;
    auVar36 = vsubss_avx512f(auVar46,auVar41);
    fVar195 = auVar36._0_4_;
    fVar202 = fVar195 * fVar195 * fVar195;
    fVar197 = auVar41._0_4_;
    fVar92 = fVar197 * 3.0 * fVar195 * fVar195;
    fVar195 = fVar195 * fVar197 * fVar197 * 3.0;
    auVar121._4_4_ = fVar202;
    auVar121._0_4_ = fVar202;
    auVar121._8_4_ = fVar202;
    auVar121._12_4_ = fVar202;
    auVar110._4_4_ = fVar92;
    auVar110._0_4_ = fVar92;
    auVar110._8_4_ = fVar92;
    auVar110._12_4_ = fVar92;
    auVar95._4_4_ = fVar195;
    auVar95._0_4_ = fVar195;
    auVar95._8_4_ = fVar195;
    auVar95._12_4_ = fVar195;
    fVar197 = fVar197 * fVar197 * fVar197;
    auVar143._0_4_ = (float)local_108._0_4_ * fVar197;
    auVar143._4_4_ = (float)local_108._4_4_ * fVar197;
    auVar143._8_4_ = fStack_100 * fVar197;
    auVar143._12_4_ = fStack_fc * fVar197;
    auVar36 = vfmadd231ps_fma(auVar143,local_278,auVar95);
    auVar36 = vfmadd231ps_fma(auVar36,local_268,auVar110);
    auVar36 = vfmadd231ps_avx512vl(auVar36,local_308,auVar121);
    auVar96._8_8_ = auVar36._0_8_;
    auVar96._0_8_ = auVar36._0_8_;
    auVar36 = vshufpd_avx(auVar36,auVar36,3);
    auVar45 = vshufps_avx(auVar41,auVar41,0x55);
    auVar36 = vsubps_avx(auVar36,auVar96);
    auVar45 = vfmadd213ps_fma(auVar36,auVar45,auVar96);
    fVar202 = auVar45._0_4_;
    auVar36 = vshufps_avx(auVar45,auVar45,0x55);
    auVar97._0_4_ = auVar48._0_4_ * fVar202 + auVar53._0_4_ * auVar36._0_4_;
    auVar97._4_4_ = auVar48._4_4_ * fVar202 + auVar53._4_4_ * auVar36._4_4_;
    auVar97._8_4_ = auVar48._8_4_ * fVar202 + auVar53._8_4_ * auVar36._8_4_;
    auVar97._12_4_ = auVar48._12_4_ * fVar202 + auVar53._12_4_ * auVar36._12_4_;
    auVar41 = vsubps_avx(auVar41,auVar97);
    auVar36 = vandps_avx512vl(auVar45,auVar229._0_16_);
    auVar45 = vprolq_avx512vl(auVar36,0x20);
    auVar36 = vmaxss_avx(auVar45,auVar36);
    bVar34 = (float)local_118._0_4_ < auVar36._0_4_;
  } while ((float)local_118._0_4_ <= auVar36._0_4_);
  auVar36 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_019f645b;
  auVar48 = vucomiss_avx512f(auVar36);
  auVar237 = ZEXT1664(auVar48);
  if (bVar34) goto LAB_019f645b;
  vmovshdup_avx(auVar36);
  auVar48 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_019f645b;
  auVar46 = vucomiss_avx512f(auVar48);
  auVar237 = ZEXT1664(auVar46);
  if (bVar34) goto LAB_019f645b;
  auVar45 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar40 = vinsertps_avx(auVar45,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->org).field_0;
  auVar45 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar45 = vdpps_avx(auVar45,auVar40,0x7f);
  auVar44 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar44 = vdpps_avx(auVar44,auVar40,0x7f);
  auVar43 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar43 = vdpps_avx(auVar43,auVar40,0x7f);
  auVar42 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar42 = vdpps_avx(auVar42,auVar40,0x7f);
  auVar39 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar39 = vdpps_avx(auVar39,auVar40,0x7f);
  auVar37 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar37 = vdpps_avx(auVar37,auVar40,0x7f);
  auVar38 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar38 = vdpps_avx(auVar38,auVar40,0x7f);
  auVar41 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar40 = vdpps_avx(auVar41,auVar40,0x7f);
  auVar41 = vsubss_avx512f(auVar46,auVar48);
  fVar202 = auVar48._0_4_;
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar202)),auVar41,auVar45);
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar202)),auVar41,auVar44);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar202)),auVar41,auVar43);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar40._0_4_)),auVar41,auVar42);
  auVar46 = vsubss_avx512f(auVar46,auVar36);
  auVar144._0_4_ = auVar46._0_4_;
  fVar202 = auVar144._0_4_ * auVar144._0_4_ * auVar144._0_4_;
  fVar199 = auVar36._0_4_;
  fVar92 = fVar199 * 3.0 * auVar144._0_4_ * auVar144._0_4_;
  fVar195 = auVar144._0_4_ * fVar199 * fVar199 * 3.0;
  fVar200 = fVar199 * fVar199 * fVar199;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar43._0_4_)),ZEXT416((uint)fVar195),auVar44)
  ;
  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar92),auVar45);
  auVar48 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar202),auVar48);
  fVar197 = auVar48._0_4_;
  if ((fVar197 < (ray->org).field_0.m128[3]) || (fVar201 = ray->tfar, fVar201 < fVar197))
  goto LAB_019f645b;
  auVar48 = vshufps_avx(auVar36,auVar36,0x55);
  auVar45 = vsubps_avx512vl(auVar47,auVar48);
  fVar98 = auVar48._0_4_;
  auVar174._0_4_ = fVar98 * (float)local_1b8._0_4_;
  fVar100 = auVar48._4_4_;
  auVar174._4_4_ = fVar100 * (float)local_1b8._4_4_;
  fVar114 = auVar48._8_4_;
  auVar174._8_4_ = fVar114 * fStack_1b0;
  fVar115 = auVar48._12_4_;
  auVar174._12_4_ = fVar115 * fStack_1ac;
  auVar179._0_4_ = fVar98 * (float)local_208._0_4_;
  auVar179._4_4_ = fVar100 * (float)local_208._4_4_;
  auVar179._8_4_ = fVar114 * fStack_200;
  auVar179._12_4_ = fVar115 * fStack_1fc;
  auVar192._0_4_ = fVar98 * (float)local_218._0_4_;
  auVar192._4_4_ = fVar100 * (float)local_218._4_4_;
  auVar192._8_4_ = fVar114 * fStack_210;
  auVar192._12_4_ = fVar115 * fStack_20c;
  auVar152._0_4_ = fVar98 * (float)local_1d8._0_4_;
  auVar152._4_4_ = fVar100 * (float)local_1d8._4_4_;
  auVar152._8_4_ = fVar114 * fStack_1d0;
  auVar152._12_4_ = fVar115 * fStack_1cc;
  auVar48 = vfmadd231ps_fma(auVar174,auVar45,local_1a8);
  auVar47 = vfmadd231ps_fma(auVar179,auVar45,local_1e8);
  auVar46 = vfmadd231ps_fma(auVar192,auVar45,local_1f8);
  auVar45 = vfmadd231ps_fma(auVar152,auVar45,local_1c8);
  auVar48 = vsubps_avx(auVar47,auVar48);
  auVar47 = vsubps_avx(auVar46,auVar47);
  auVar46 = vsubps_avx(auVar45,auVar46);
  auVar193._0_4_ = fVar199 * auVar47._0_4_;
  auVar193._4_4_ = fVar199 * auVar47._4_4_;
  auVar193._8_4_ = fVar199 * auVar47._8_4_;
  auVar193._12_4_ = fVar199 * auVar47._12_4_;
  auVar144._4_4_ = auVar144._0_4_;
  auVar144._8_4_ = auVar144._0_4_;
  auVar144._12_4_ = auVar144._0_4_;
  auVar48 = vfmadd231ps_fma(auVar193,auVar144,auVar48);
  auVar153._0_4_ = fVar199 * auVar46._0_4_;
  auVar153._4_4_ = fVar199 * auVar46._4_4_;
  auVar153._8_4_ = fVar199 * auVar46._8_4_;
  auVar153._12_4_ = fVar199 * auVar46._12_4_;
  auVar47 = vfmadd231ps_fma(auVar153,auVar144,auVar47);
  auVar154._0_4_ = fVar199 * auVar47._0_4_;
  auVar154._4_4_ = fVar199 * auVar47._4_4_;
  auVar154._8_4_ = fVar199 * auVar47._8_4_;
  auVar154._12_4_ = fVar199 * auVar47._12_4_;
  auVar48 = vfmadd231ps_fma(auVar154,auVar144,auVar48);
  auVar13._8_4_ = 0x40400000;
  auVar13._0_8_ = 0x4040000040400000;
  auVar13._12_4_ = 0x40400000;
  auVar48 = vmulps_avx512vl(auVar48,auVar13);
  pGVar5 = (context->scene->geometries).items[local_310].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar21 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019f7272;
    auVar135._0_4_ = fVar200 * (float)local_158._0_4_;
    auVar135._4_4_ = fVar200 * (float)local_158._4_4_;
    auVar135._8_4_ = fVar200 * fStack_150;
    auVar135._12_4_ = fVar200 * fStack_14c;
    auVar122._4_4_ = fVar195;
    auVar122._0_4_ = fVar195;
    auVar122._8_4_ = fVar195;
    auVar122._12_4_ = fVar195;
    auVar47 = vfmadd132ps_fma(auVar122,auVar135,local_148);
    auVar111._4_4_ = fVar92;
    auVar111._0_4_ = fVar92;
    auVar111._8_4_ = fVar92;
    auVar111._12_4_ = fVar92;
    auVar47 = vfmadd132ps_fma(auVar111,auVar47,local_138);
    auVar104._4_4_ = fVar202;
    auVar104._0_4_ = fVar202;
    auVar104._8_4_ = fVar202;
    auVar104._12_4_ = fVar202;
    auVar45 = vfmadd132ps_fma(auVar104,auVar47,local_128);
    auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar46 = vshufps_avx(auVar48,auVar48,0xc9);
    auVar105._0_4_ = auVar45._0_4_ * auVar46._0_4_;
    auVar105._4_4_ = auVar45._4_4_ * auVar46._4_4_;
    auVar105._8_4_ = auVar45._8_4_ * auVar46._8_4_;
    auVar105._12_4_ = auVar45._12_4_ * auVar46._12_4_;
    auVar47 = vfmsub231ps_fma(auVar105,auVar48,auVar47);
    auVar48 = vshufps_avx(auVar47,auVar47,0xe9);
    local_188 = vmovlps_avx(auVar48);
    local_180 = auVar47._0_4_;
    local_17c = vmovlps_avx(auVar36);
    local_174 = (int)local_258;
    local_170 = (int)local_310;
    local_16c = context->user->instID[0];
    local_168 = context->user->instPrimID[0];
    ray->tfar = fVar197;
    local_32c = -1;
    local_248.valid = &local_32c;
    local_248.geometryUserPtr = pGVar5->userPtr;
    local_248.context = context->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019f71a5:
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var6)(&local_248);
        auVar236 = ZEXT1664(local_328);
        auVar237 = ZEXT464(0x3f800000);
        auVar234 = ZEXT3264(_DAT_01fb9fe0);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar233 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar232 = ZEXT1664(auVar36);
        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar231 = ZEXT3264(auVar61);
        auVar73._16_16_ = auVar61._16_16_;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar230 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar229 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar228 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
        auVar239 = ZEXT1664(auVar36);
        if (*local_248.valid == 0) goto LAB_019f7264;
      }
      bVar21 = 1;
      goto LAB_019f7272;
    }
    (*pGVar5->occlusionFilterN)(&local_248);
    auVar236 = ZEXT1664(local_328);
    auVar237 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar233 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar232 = ZEXT1664(auVar36);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar231 = ZEXT3264(auVar61);
    auVar73._16_16_ = auVar61._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar230 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar229 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar228 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
    auVar239 = ZEXT1664(auVar36);
    if (*local_248.valid != 0) goto LAB_019f71a5;
LAB_019f7264:
    auVar237 = ZEXT464(0x3f800000);
    ray->tfar = fVar201;
  }
  bVar21 = 0;
LAB_019f7272:
  bVar31 = (bool)(bVar31 | bVar21);
  goto LAB_019f645b;
LAB_019f727a:
  auVar37 = vinsertps_avx(auVar49,auVar50,0x10);
  goto LAB_019f5f5e;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }